

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O0

void __thiscall xmrig::OclThread::OclThread(OclThread *this,Value *value)

{
  bool bVar1;
  uint uVar2;
  SizeType SVar3;
  uint *puVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  vector<long,_std::allocator<long>_> *pvVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  OclThread *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *affinity;
  ValueIterator __end2;
  ValueIterator __begin2;
  ConstArray *__range2;
  Value *threads;
  Value *si;
  undefined4 in_stack_fffffffffffffea8;
  SizeType in_stack_fffffffffffffeac;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffeb0;
  long *in_stack_fffffffffffffeb8;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffec0;
  Value *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar7;
  pointer *local_70;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_68;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_60;
  vector<long,_std::allocator<long>_> *local_58;
  uint local_50;
  uint local_4c [3];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_40;
  uint local_34 [3];
  uint local_28 [6];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_10;
  
  in_RDI->m_datasetHost = false;
  in_RDI->m_gcnAsm = true;
  local_10 = in_RSI;
  std::bitset<2UL>::bitset
            ((bitset<2UL> *)in_stack_fffffffffffffec0,(unsigned_long_long)in_stack_fffffffffffffeb8)
  ;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x2135f5);
  in_RDI->m_bfactor = 6;
  in_RDI->m_index = 0;
  in_RDI->m_intensity = 0;
  in_RDI->m_memChunk = 2;
  in_RDI->m_stridedIndex = 2;
  in_RDI->m_unrollFactor = 8;
  in_RDI->m_worksize = 0;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(local_10);
  if (bVar1) {
    uVar2 = Json::getUint(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    in_RDI->m_index = uVar2;
    local_28[2] = Json::getUint(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                                (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_28[1] = 0x80;
    puVar4 = std::min<unsigned_int>(local_28 + 2,local_28 + 1);
    local_28[0] = 1;
    puVar4 = std::max<unsigned_int>(puVar4,local_28);
    in_RDI->m_worksize = *puVar4;
    local_34[2] = Json::getUint(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                                (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_34[1] = 0x80;
    puVar4 = std::min<unsigned_int>(local_34 + 2,local_34 + 1);
    local_34[0] = 1;
    puVar4 = std::max<unsigned_int>(puVar4,local_34);
    in_RDI->m_unrollFactor = *puVar4;
    uVar2 = Json::getUint(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                          (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    setIntensity(in_RDI,uVar2);
    local_40 = Json::getArray(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(local_40);
    if ((bVar1) &&
       (SVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(local_40), 1 < SVar3)) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      local_4c[2] = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(pGVar5);
      local_4c[1] = 2;
      puVar4 = std::min<unsigned_int>(local_4c + 2,local_4c + 1);
      in_RDI->m_stridedIndex = *puVar4;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      local_4c[0] = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(pGVar5);
      local_50 = 0x12;
      puVar4 = std::min<unsigned_int>(local_4c,&local_50);
      in_RDI->m_memChunk = *puVar4;
    }
    else {
      in_RDI->m_stridedIndex = 0;
      in_RDI->m_memChunk = 0;
      std::bitset<2UL>::set
                ((bitset<2UL> *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                 SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
    }
    pvVar6 = (vector<long,_std::allocator<long>_> *)
             Json::getArray(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    local_58 = pvVar6;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)pvVar6);
    uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    if (bVar1) {
      SVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_58);
      std::vector<long,_std::allocator<long>_>::reserve(pvVar6,CONCAT44(uVar7,SVar3));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_60 = &local_68;
      local_70 = (pointer *)
                 rapidjson::
                 GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 ::begin((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                          *)0x213a1e);
      pvVar6 = (vector<long,_std::allocator<long>_> *)
               rapidjson::
               GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               ::end((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                      *)0x213a3f);
      in_stack_fffffffffffffec0 = pvVar6;
      for (; (vector<long,_std::allocator<long>_> *)local_70 != pvVar6; local_70 = local_70 + 2) {
        in_stack_fffffffffffffeb8 =
             (long *)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetInt64((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)local_70);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
      rapidjson::
      GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
      ::~GenericArray(&local_68);
    }
    bVar1 = std::vector<long,_std::allocator<long>_>::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      std::vector<long,_std::allocator<long>_>::emplace_back<int>
                (in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8);
    }
  }
  return;
}

Assistant:

xmrig::OclThread::OclThread(const rapidjson::Value &value)
{
    if (!value.IsObject()) {
        return;
    }

    m_index         = Json::getUint(value, kIndex);
    m_worksize      = std::max(std::min(Json::getUint(value, kWorksize), 128u), 1u);
    m_unrollFactor  = std::max(std::min(Json::getUint(value, kUnroll, m_unrollFactor), 128u), 1u);

    setIntensity(Json::getUint(value, kIntensity));

    const auto &si = Json::getArray(value, kStridedIndex);
    if (si.IsArray() && si.Size() >= 2) {
        m_stridedIndex = std::min(si[0].GetUint(), 2u);
        m_memChunk     = std::min(si[1].GetUint(), 18u);
    }
    else {
        m_stridedIndex = 0;
        m_memChunk     = 0;
        m_fields.set(STRIDED_INDEX_FIELD, false);
    }

    const auto &threads = Json::getArray(value, kThreads);
    if (threads.IsArray()) {
        m_threads.reserve(threads.Size());

        for (const auto &affinity : threads.GetArray()) {
            m_threads.emplace_back(affinity.GetInt64());
        }
    }

    if (m_threads.empty()) {
        m_threads.emplace_back(-1);
    }
}